

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge0
          (CrossingProcessor *this,ShapeEdgeId a_id,Edge *a,CrossingIterator *it)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  PointCrossingResult PVar4;
  long lVar5;
  IndexCrossing *pIVar6;
  double *ap;
  bool bVar7;
  bool bVar8;
  S2LogMessage local_40;
  
  dVar2 = (a->v0).c_[0];
  if ((dVar2 == (a->v1).c_[0]) && (!NAN(dVar2) && !NAN((a->v1).c_[0]))) {
    lVar5 = -0x10;
    do {
      bVar7 = lVar5 == 0;
      if (bVar7) goto LAB_0019fa13;
      dVar2 = *(double *)((long)(a->v1).c_ + lVar5);
      pdVar1 = (double *)((long)a[1].v0.c_ + lVar5);
      lVar5 = lVar5 + 8;
    } while ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1)));
  }
  bVar7 = false;
LAB_0019fa13:
  if (bVar7) {
    if (this->invert_a_ == this->invert_result_) {
      PVar4 = ProcessPointCrossings(this,a_id,&a->v0,it);
      bVar3 = this->invert_b_;
      bVar8 = this->inside_ != bVar3;
      bVar7 = this->polygon_model_ == CLOSED;
      if (this->polygon_model_ == SEMI_OPEN) {
        bVar7 = bVar8;
      }
      if (((uint3)PVar4 >> 0x10 & 1) == 0) {
        bVar7 = bVar8;
      }
      bVar7 = (bool)(PVar4.matches_polyline & 1U | bVar7);
      bVar8 = true;
      if ((this->is_union_ & 1U) != 0) {
        bVar8 = bVar7;
      }
      if (((uint3)PVar4 & 1) == 0) {
        bVar8 = bVar7;
      }
      bVar7 = true;
      if (bVar8 != bVar3) {
        bVar7 = AddPointEdge(this,&a->v0,0);
      }
    }
    else {
      bVar7 = true;
      pIVar6 = (it->it_)._M_current;
      while (pIVar6->a == a_id) {
        (it->it_)._M_current = pIVar6 + 1;
        CrossingIterator::Update(it);
        pIVar6 = (it->it_)._M_current;
      }
    }
    return bVar7;
  }
  S2LogMessage::S2LogMessage
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x52d,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_40.stream_,"Check failed: (a.v0) == (a.v1) ",0x1f);
  abort();
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge0(
    ShapeEdgeId a_id, const S2Shape::Edge& a, CrossingIterator* it) {
  S2_DCHECK_EQ(a.v0, a.v1);
  // When a region is inverted, all points and polylines are discarded.
  if (invert_a_ != invert_result_) {
    SkipCrossings(a_id, it);
    return true;
  }
  PointCrossingResult r = ProcessPointCrossings(a_id, a.v0, it);

  // "contained" indicates whether the current point is inside the polygonal
  // interior of the opposite region, using semi-open boundaries.
  bool contained = inside_ ^ invert_b_;
  if (r.matches_polygon && polygon_model_ != PolygonModel::SEMI_OPEN) {
    contained = (polygon_model_ == PolygonModel::CLOSED);
  }
  if (r.matches_polyline) contained = true;

  // The output of UNION includes duplicate values, so ensure that points are
  // not suppressed by other points.
  if (r.matches_point && !is_union_) contained = true;

  // Test whether the point is contained after region B is inverted.
  if (contained == invert_b_) return true;  // Don't exit early.
  return AddPointEdge(a.v0, 0);
}